

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O2

void Fossilize::DestroyDevice(VkDevice device,VkAllocationCallbacks *pAllocator)

{
  void *key;
  Device *pDVar1;
  iterator __it;
  VkAllocationCallbacks *m;
  void *local_28;
  
  m = pAllocator;
  std::mutex::lock((mutex *)globalLock);
  key = *(void **)device;
  pDVar1 = getLayerData<Fossilize::Device>
                     (key,(unordered_map<void_*,_std::unique_ptr<Fossilize::Device,_std::default_delete<Fossilize::Device>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::unique_ptr<Fossilize::Device,_std::default_delete<Fossilize::Device>_>_>_>_>
                           *)m);
  (*pDVar1->pTable->DestroyDevice)(device,pAllocator);
  local_28 = key;
  __it = std::
         _Hashtable<void_*,_std::pair<void_*const,_std::unique_ptr<Fossilize::Device,_std::default_delete<Fossilize::Device>_>_>,_std::allocator<std::pair<void_*const,_std::unique_ptr<Fossilize::Device,_std::default_delete<Fossilize::Device>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
         ::find((_Hashtable<void_*,_std::pair<void_*const,_std::unique_ptr<Fossilize::Device,_std::default_delete<Fossilize::Device>_>_>,_std::allocator<std::pair<void_*const,_std::unique_ptr<Fossilize::Device,_std::default_delete<Fossilize::Device>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)deviceData,&local_28);
  std::
  _Hashtable<void_*,_std::pair<void_*const,_std::unique_ptr<Fossilize::Device,_std::default_delete<Fossilize::Device>_>_>,_std::allocator<std::pair<void_*const,_std::unique_ptr<Fossilize::Device,_std::default_delete<Fossilize::Device>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::erase((_Hashtable<void_*,_std::pair<void_*const,_std::unique_ptr<Fossilize::Device,_std::default_delete<Fossilize::Device>_>_>,_std::allocator<std::pair<void_*const,_std::unique_ptr<Fossilize::Device,_std::default_delete<Fossilize::Device>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           *)deviceData,
          (const_iterator)
          __it.
          super__Node_iterator_base<std::pair<void_*const,_std::unique_ptr<Fossilize::Device,_std::default_delete<Fossilize::Device>_>_>,_false>
          ._M_cur);
  pthread_mutex_unlock((pthread_mutex_t *)globalLock);
  return;
}

Assistant:

static VKAPI_ATTR void VKAPI_CALL DestroyDevice(VkDevice device, const VkAllocationCallbacks *pAllocator)
{
	lock_guard<mutex> holder{ globalLock };

	void *key = getDispatchKey(device);
	auto *layer = getLayerData(key, deviceData);

	layer->getTable()->DestroyDevice(device, pAllocator);
	destroyLayerData(key, deviceData);
}